

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O1

Color * __thiscall
Scene::shade(Color *__return_storage_ptr__,Scene *this,Medium *curMed,double weight,Vector *p,
            Vector *view,GeometricObject *obj)

{
  double dVar1;
  double dVar2;
  long *plVar3;
  long lVar4;
  pointer psVar5;
  Medium *pMVar6;
  Medium *pMVar7;
  ulong uVar8;
  long lVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  Color *color;
  SurfaceData txt;
  Ray ray;
  Vector l;
  double local_1b8;
  double local_1b0;
  double local_1a8;
  double local_1a0;
  double local_188;
  double local_178;
  double local_168;
  SurfaceData local_130;
  double local_a8;
  undefined8 uStack_a0;
  Ray local_90;
  double local_60;
  double local_58;
  double local_50;
  Color local_48;
  
  GeometricObject::find_texture(obj,p,&local_130);
  dVar11 = view->z * local_130.n.z + view->x * local_130.n.x + view->y * local_130.n.y;
  local_188 = dVar11;
  if (0.0 < dVar11) {
    local_130.n.x = -local_130.n.x;
    local_130.n.y = -local_130.n.y;
    local_130.n.z = -local_130.n.z;
    local_188 = -dVar11;
  }
  local_90.org.x = p->x;
  local_90.org.y = p->y;
  local_90.org.z = p->z;
  local_1b8 = (this->ambient).x * local_130.color.x * local_130.ka;
  local_1a8 = (this->ambient).y * local_130.color.y * local_130.ka;
  local_1b0 = (this->ambient).z * local_130.color.z * local_130.ka;
  __return_storage_ptr__->x = local_1b8;
  __return_storage_ptr__->y = local_1a8;
  __return_storage_ptr__->z = local_1b0;
  psVar5 = (this->light).
           super__Vector_base<std::shared_ptr<LightSource>,_std::allocator<std::shared_ptr<LightSource>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->light).
      super__Vector_base<std::shared_ptr<LightSource>,_std::allocator<std::shared_ptr<LightSource>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != psVar5) {
    lVar9 = 0;
    uVar8 = 0;
    do {
      plVar3 = *(long **)((long)&(psVar5->
                                 super___shared_ptr<LightSource,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                         + lVar9);
      local_178 = (double)(**(code **)(*plVar3 + 0x10))(plVar3,this,p,&local_60);
      if (threshold < local_178) {
        dVar14 = local_130.n.z * local_50 + local_130.n.x * local_60 + local_130.n.y * local_58;
        if (dVar14 <= threshold) {
          if ((dVar14 < -threshold) && (threshold < local_130.kt)) {
            dVar14 = dVar14 * -local_130.kd * local_130.kt * local_178;
            if (threshold < dVar14) {
              lVar4 = *(long *)((long)&(((this->light).
                                         super__Vector_base<std::shared_ptr<LightSource>,_std::allocator<std::shared_ptr<LightSource>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->
                                       super___shared_ptr<LightSource,_(__gnu_cxx::_Lock_policy)2>).
                                       _M_ptr + lVar9);
              local_1b8 = local_1b8 + *(double *)(lVar4 + 8) * local_130.color.x * dVar14;
              local_1a8 = local_1a8 + *(double *)(lVar4 + 0x10) * local_130.color.y * dVar14;
              local_1b0 = local_1b0 + *(double *)(lVar4 + 0x18) * local_130.color.z * dVar14;
            }
            local_178 = local_178 * local_130.kt * local_130.ks;
            if ((((threshold < local_178) && (threshold < view->x - local_60)) &&
                (threshold < view->y - local_58)) && (threshold < view->z - local_50)) {
              pMVar7 = &local_130.med;
              if (0.0 < dVar11) {
                pMVar7 = &Grayzer::Medium::air;
              }
              dVar14 = pMVar7->ior / curMed->ior;
              dVar12 = -view->x - local_60 * dVar14;
              dVar13 = -view->y - local_58 * dVar14;
              dVar14 = -view->z - local_50 * dVar14;
              dVar10 = dVar14 * dVar14 + dVar12 * dVar12 + dVar13 * dVar13;
              if (dVar10 < 0.0) {
                uStack_a0 = 0x8000000000000000;
                local_a8 = dVar14;
                dVar10 = sqrt(dVar10);
                dVar14 = local_a8;
              }
              else {
                dVar10 = SQRT(dVar10);
              }
              dVar12 = dVar12 / dVar10;
              dVar13 = dVar13 / dVar10;
              dVar14 = dVar14 / dVar10;
              lVar4 = *(long *)((long)&(((this->light).
                                         super__Vector_base<std::shared_ptr<LightSource>,_std::allocator<std::shared_ptr<LightSource>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->
                                       super___shared_ptr<LightSource,_(__gnu_cxx::_Lock_policy)2>).
                                       _M_ptr + lVar9);
              local_1a0 = *(double *)(lVar4 + 8) * local_178;
              local_168 = *(double *)(lVar4 + 0x10) * local_178;
              local_178 = local_178 * *(double *)(lVar4 + 0x18);
              goto LAB_00103eeb;
            }
          }
        }
        else {
          if (threshold < local_130.kd) {
            lVar4 = *(long *)((long)&(((this->light).
                                       super__Vector_base<std::shared_ptr<LightSource>,_std::allocator<std::shared_ptr<LightSource>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->
                                     super___shared_ptr<LightSource,_(__gnu_cxx::_Lock_policy)2>).
                                     _M_ptr + lVar9);
            dVar14 = dVar14 * local_130.kd * local_178;
            local_1b8 = local_1b8 + *(double *)(lVar4 + 8) * local_130.color.x * dVar14;
            local_1a8 = local_1a8 + *(double *)(lVar4 + 0x10) * local_130.color.y * dVar14;
            local_1b0 = local_1b0 + dVar14 * *(double *)(lVar4 + 0x18) * local_130.color.z;
          }
          if (threshold < local_130.ks) {
            dVar12 = local_60 - view->x;
            dVar13 = local_58 - view->y;
            dVar14 = local_50 - view->z;
            dVar10 = dVar14 * dVar14 + dVar12 * dVar12 + dVar13 * dVar13;
            if (dVar10 < 0.0) {
              local_a8 = dVar14;
              dVar10 = sqrt(dVar10);
              dVar14 = local_a8;
            }
            else {
              dVar10 = SQRT(dVar10);
            }
            dVar12 = dVar12 / dVar10;
            dVar13 = dVar13 / dVar10;
            lVar4 = *(long *)((long)&(((this->light).
                                       super__Vector_base<std::shared_ptr<LightSource>,_std::allocator<std::shared_ptr<LightSource>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->
                                     super___shared_ptr<LightSource,_(__gnu_cxx::_Lock_policy)2>).
                                     _M_ptr + lVar9);
            dVar14 = dVar14 / dVar10;
            local_1a0 = *(double *)(lVar4 + 8) * local_130.ks * local_178;
            local_168 = *(double *)(lVar4 + 0x10) * local_130.ks * local_178;
            local_178 = local_130.ks * *(double *)(lVar4 + 0x18) * local_178;
LAB_00103eeb:
            dVar14 = pow(dVar14 * local_130.n.z + dVar12 * local_130.n.x + dVar13 * local_130.n.y,
                         (double)local_130.p);
            local_1b8 = local_1b8 + local_1a0 * dVar14;
            local_1a8 = local_1a8 + local_168 * dVar14;
            local_1b0 = local_1b0 + local_178 * dVar14;
          }
        }
      }
      uVar8 = uVar8 + 1;
      psVar5 = (this->light).
               super__Vector_base<std::shared_ptr<LightSource>,_std::allocator<std::shared_ptr<LightSource>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar9 = lVar9 + 0x10;
    } while (uVar8 < (ulong)((long)(this->light).
                                   super__Vector_base<std::shared_ptr<LightSource>,_std::allocator<std::shared_ptr<LightSource>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)psVar5 >> 4));
  }
  __return_storage_ptr__->x = local_1b8;
  __return_storage_ptr__->y = local_1a8;
  __return_storage_ptr__->z = local_1b0;
  dVar14 = weight * local_130.kt;
  if ((threshold < local_130.kr * weight) && (level < maxLevel)) {
    dVar10 = local_188 + local_188;
    local_90.dir.x = view->x - local_130.n.x * dVar10;
    local_90.dir.y = view->y - local_130.n.y * dVar10;
    local_90.dir.z = view->z - dVar10 * local_130.n.z;
    trace(&local_48,this,curMed,local_130.kr * weight,&local_90);
    __return_storage_ptr__->x = local_48.x * local_130.kr + __return_storage_ptr__->x;
    __return_storage_ptr__->y = local_48.y * local_130.kr + __return_storage_ptr__->y;
    __return_storage_ptr__->z = local_130.kr * local_48.z + __return_storage_ptr__->z;
  }
  if ((threshold < dVar14) && (level < maxLevel)) {
    pMVar7 = &local_130.med;
    pMVar6 = pMVar7;
    if (0.0 < dVar11) {
      pMVar6 = &Grayzer::Medium::air;
    }
    dVar12 = curMed->ior / pMVar6->ior;
    dVar10 = (local_188 * local_188 + -1.0) * dVar12 * dVar12 + 1.0;
    if (threshold < dVar10) {
      local_188 = -local_188;
      dVar13 = view->x;
      dVar1 = view->y;
      dVar2 = view->z;
      if (dVar10 < 0.0) {
        dVar10 = sqrt(dVar10);
      }
      else {
        dVar10 = SQRT(dVar10);
      }
      dVar10 = dVar12 * local_188 - dVar10;
      local_90.dir.x = dVar13 * dVar12 + local_130.n.x * dVar10;
      local_90.dir.y = dVar1 * dVar12 + local_130.n.y * dVar10;
      local_90.dir.z = dVar2 * dVar12 + dVar10 * local_130.n.z;
      if (0.0 < dVar11) {
        pMVar7 = &Grayzer::Medium::air;
      }
      trace(&local_48,this,pMVar7,dVar14,&local_90);
      __return_storage_ptr__->x = local_48.x * local_130.kt + __return_storage_ptr__->x;
      __return_storage_ptr__->y = local_48.y * local_130.kt + __return_storage_ptr__->y;
      __return_storage_ptr__->z = local_130.kt * local_48.z + __return_storage_ptr__->z;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Color Scene::shade(Medium& curMed, double weight, Vector p, Vector view, GeometricObject *obj)
{
   SurfaceData txt;
   Ray   ray;
   Color color;
   Vector l;   // light vector
   double sh;  // light shadow coeff.
   Vector h;   // vector between -View and light
   double ln, vn;
   double t;
   bool entering = true; // flag whether we're entering object
   int   i;

   obj->find_texture(p, txt);
   if((vn = view & txt.n) > 0) // force (-View,n) > 0
   {
      txt.n = -txt.n;
      vn = -vn;
      entering = false;
   }

   ray.org = p;
   color = ambient * txt.color * txt.ka; // get ambient light

   for(i = 0; i < light.size(); i++)
   {
      if((sh = light[i]->shadow(this, p,l)) > threshold)
      {
         if((ln = (l & txt.n)) > threshold) //  light is visible
         {
            // Diffuse
            if(txt.kd > threshold)
               color += light[i]->color * txt.color * (txt.kd * sh * ln);

            // Specular & Phong-like
            if(txt.ks > threshold)
            {
               h = normalize(l - view);
               color += light[i]->color * txt.ks * sh * pow(txt.n & h, txt.p);
            }
         }
         else
         if(txt.kt > threshold && ln < -threshold)
         {
            t = -txt.kd * txt.kt * sh * ln;

            if(t > threshold)
               color += light[i]->color * txt.color * t;

            t = txt.ks * txt.kt * sh;

            if(t > threshold)
            {
               if((view - l) > threshold)
               {
                  double eta = (entering ? txt.med.ior : Grayzer::Medium::air.ior) / curMed.ior;
                  h = normalize( -view - l * eta );
                  color += light[i]->color * t * pow(txt.n & h, txt.p);
               }
            }
         }
      }
   }

   double rWeight = weight * txt.kr; // reflected
   double tWeight = weight * txt.kt; // transmitted

   // check for reflected ray
   if(rWeight > threshold && level < maxLevel)
   {
      ray.dir = view - txt.n * (2 * vn); // get reflected ray
      color += txt.kr * trace(curMed, rWeight, ray);
   }

   // check for transmitted ray
   if(tWeight > threshold && level < maxLevel)
   {
      double eta = curMed.ior / (entering ? txt.med.ior : Grayzer::Medium::air.ior);
      double ci = -vn; //  cosine of incident angle
      double ctSq = 1 + eta * eta * (ci *  ci - 1);

      if(ctSq > threshold) // not a Total Internal Reflection
      {
         ray.dir = view * eta + txt.n * (eta * ci - sqrt(ctSq));
         if(entering) // ray enters object
            color += txt.kt * trace(txt.med, tWeight, ray);
         else          // ray leaves object
            color += txt.kt * trace(Grayzer::Medium::air, tWeight, ray);
      }
   }
   return color;
}